

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfunc.h
# Opt level: O2

int __thiscall CVmDbgFramePtr::is_nested_in(CVmDbgFramePtr *this,CVmDbgTablePtr *dp,int i)

{
  ushort uVar1;
  uchar *puVar2;
  long lVar3;
  ulong uVar4;
  ushort *puVar5;
  
  puVar5 = (ushort *)this->p_;
  while( true ) {
    uVar1 = *puVar5;
    uVar4 = (ulong)uVar1;
    if (((uint)uVar1 == i) || (uVar1 == 0)) break;
    puVar2 = dp->p_;
    lVar3 = *(ushort *)(puVar2 + G_dbg_hdr_size_X) * G_line_entry_size_X + G_dbg_hdr_size_X;
    puVar5 = (ushort *)
             (puVar2 + (ulong)*(ushort *)(puVar2 + uVar4 * 2 + lVar3 + 4) + uVar4 * 2 + lVar3 + 4);
  }
  return (int)(uVar4 != 0);
}

Assistant:

uint get_enclosing_frame() const { return osrp2(p_); }